

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopClear(sqlite3 *db,WhereLoop *p)

{
  WhereLoop *p_local;
  sqlite3 *db_local;
  
  if (p->aLTerm != p->aLTermSpace) {
    sqlite3DbFreeNN(db,p->aLTerm);
  }
  whereLoopClearUnion(db,p);
  whereLoopInit(p);
  return;
}

Assistant:

static void whereLoopClear(sqlite3 *db, WhereLoop *p){
  if( p->aLTerm!=p->aLTermSpace ) sqlite3DbFreeNN(db, p->aLTerm);
  whereLoopClearUnion(db, p);
  whereLoopInit(p);
}